

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)13>_> *
vkt::api::anon_unknown_1::ImageView::create
          (Move<vk::Handle<(vk::HandleType)13>_> *__return_storage_ptr__,Environment *env,
          Resources *res,Parameters *params)

{
  Handle<(vk::HandleType)9> *pHVar1;
  undefined1 local_78 [8];
  VkImageViewCreateInfo imageViewInfo;
  Parameters *params_local;
  Resources *res_local;
  Environment *env_local;
  
  local_78._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  imageViewInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageViewInfo._4_4_ = 0;
  imageViewInfo.pNext._0_4_ = 0;
  imageViewInfo._72_8_ = params;
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(res->image).object.super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  imageViewInfo._16_8_ = pHVar1->m_internal;
  imageViewInfo.image.m_internal._0_4_ = *(undefined4 *)(imageViewInfo._72_8_ + 0x30);
  imageViewInfo.image.m_internal._4_4_ = *(undefined4 *)(imageViewInfo._72_8_ + 0x34);
  imageViewInfo._32_8_ = *(undefined8 *)(imageViewInfo._72_8_ + 0x38);
  imageViewInfo.components._0_8_ = *(undefined8 *)(imageViewInfo._72_8_ + 0x40);
  imageViewInfo.components._8_8_ = *(undefined8 *)(imageViewInfo._72_8_ + 0x48);
  imageViewInfo.subresourceRange._0_8_ = *(undefined8 *)(imageViewInfo._72_8_ + 0x50);
  imageViewInfo.subresourceRange.levelCount = *(deUint32 *)(imageViewInfo._72_8_ + 0x58);
  ::vk::createImageView
            (__return_storage_ptr__,env->vkd,env->device,(VkImageViewCreateInfo *)local_78,
             env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkImageView> create (const Environment& env, const Resources& res, const Parameters& params)
	{
		const VkImageViewCreateInfo	imageViewInfo	=
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,
			DE_NULL,
			(VkImageViewCreateFlags)0,
			*res.image.object,
			params.viewType,
			params.format,
			params.components,
			params.subresourceRange,
		};

		return createImageView(env.vkd, env.device, &imageViewInfo, env.allocationCallbacks);
	}